

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::Formatter::make_description_abi_cxx11_(string *__return_storage_ptr__,Formatter *this,App *app)

{
  pointer pcVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  uint uVar13;
  undefined8 uVar14;
  _Alloc_hider _Var15;
  string desc;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  size_type *local_f0;
  size_type local_e8;
  size_type local_e0;
  undefined8 uStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (app->description_)._M_dataplus._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (app->description_)._M_string_length);
  uVar11 = app->require_option_min_;
  uVar8 = app->require_option_max_;
  if (app->required_ == true) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_b0," REQUIRED ");
  }
  if (uVar11 == 0 || uVar8 != uVar11) {
    if (uVar8 == 0) {
      if (uVar11 == 0) goto LAB_001126ae;
      uVar13 = 1;
      if (9 < uVar11) {
        uVar8 = uVar11;
        uVar5 = 4;
        do {
          uVar13 = uVar5;
          if (uVar8 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_00112486;
          }
          if (uVar8 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_00112486;
          }
          if (uVar8 < 10000) goto LAB_00112486;
          bVar4 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          uVar5 = uVar13 + 4;
        } while (bVar4);
        uVar13 = uVar13 + 1;
      }
LAB_00112486:
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_d0,(ulong)uVar13,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar11);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d0,0,0," \n[At least ",0xc);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar6->_M_dataplus)._M_p;
      paVar9 = &pbVar6->field_2;
      if (paVar10 == paVar9) {
        local_110.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_110._M_dataplus._M_p = (pointer)paVar10;
      }
      local_110._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_110," of the following options are required]");
      local_f0 = &local_e0;
      psVar2 = (size_type *)(pbVar6->_M_dataplus)._M_p;
      paVar10 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2 == paVar10) {
        local_e0 = paVar10->_M_allocated_capacity;
        uStack_d8 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_e0 = paVar10->_M_allocated_capacity;
        local_f0 = psVar2;
      }
      local_e8 = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_b0,(char *)local_f0,local_e8);
      goto LAB_00112669;
    }
    uVar13 = 1;
    if (uVar11 == 0) {
      if (9 < uVar8) {
        uVar11 = uVar8;
        uVar5 = 4;
        do {
          uVar13 = uVar5;
          if (uVar11 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_0011257b;
          }
          if (uVar11 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_0011257b;
          }
          if (uVar11 < 10000) goto LAB_0011257b;
          bVar4 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          uVar5 = uVar13 + 4;
        } while (bVar4);
        uVar13 = uVar13 + 1;
      }
LAB_0011257b:
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_d0,(ulong)uVar13,'\0');
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar8);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_d0,0,0," \n[At most ",0xb);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pbVar6->_M_dataplus)._M_p;
      paVar9 = &pbVar6->field_2;
      if (paVar10 == paVar9) {
        local_110.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_110.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_110._M_dataplus._M_p = (pointer)paVar10;
      }
      local_110._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_110," of the following options are allowed]");
      local_f0 = &local_e0;
      psVar2 = (size_type *)(pbVar6->_M_dataplus)._M_p;
      paVar10 = &pbVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar2 == paVar10) {
        local_e0 = paVar10->_M_allocated_capacity;
        uStack_d8 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_e0 = paVar10->_M_allocated_capacity;
        local_f0 = psVar2;
      }
      local_e8 = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_b0,(char *)local_f0,local_e8);
      goto LAB_00112669;
    }
    if (9 < uVar11) {
      uVar7 = uVar11;
      uVar5 = 4;
      do {
        uVar13 = uVar5;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0011212d;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0011212d;
        }
        if (uVar7 < 10000) goto LAB_0011212d;
        bVar4 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar5 = uVar13 + 4;
      } while (bVar4);
      uVar13 = uVar13 + 1;
    }
LAB_0011212d:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_50,(ulong)uVar13,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_50._M_dataplus._M_p,(uint)local_50._M_string_length,uVar11);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0," \n[Between ",0xb);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if (paVar10 == paVar9) {
      local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_70._M_dataplus._M_p = (pointer)paVar10;
    }
    local_70._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_70," and ");
    paVar10 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == paVar9) {
      local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_d0._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    }
    local_d0._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    uVar13 = 1;
    if (9 < uVar8) {
      uVar11 = uVar8;
      uVar5 = 4;
      do {
        uVar13 = uVar5;
        if (uVar11 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_0011227f;
        }
        if (uVar11 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_0011227f;
        }
        if (uVar11 < 10000) goto LAB_0011227f;
        bVar4 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        uVar5 = uVar13 + 4;
      } while (bVar4);
      uVar13 = uVar13 + 1;
    }
LAB_0011227f:
    paVar9 = &local_90.field_2;
    local_90._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_90,(ulong)uVar13,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,uVar8);
    uVar11 = CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length) +
             local_d0._M_string_length;
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar10) {
      uVar14 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < uVar11) {
      uVar14 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar9) {
        uVar14 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar14 < uVar11) goto LAB_001122ff;
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    }
    else {
LAB_001122ff:
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_d0,local_90._M_dataplus._M_p,
                         CONCAT44(local_90._M_string_length._4_4_,(uint)local_90._M_string_length));
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar6->_M_dataplus)._M_p;
    paVar12 = &pbVar6->field_2;
    if (paVar3 == paVar12) {
      local_110.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_110._M_dataplus._M_p = (pointer)paVar3;
    }
    local_110._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar6->_M_string_length = 0;
    paVar12->_M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_110," of the follow options are required]");
    local_f0 = (size_type *)(pbVar6->_M_dataplus)._M_p;
    paVar12 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0 == paVar12) {
      local_e0 = paVar12->_M_allocated_capacity;
      uStack_d8 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      local_f0 = &local_e0;
    }
    else {
      local_e0 = paVar12->_M_allocated_capacity;
    }
    local_e8 = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar12;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_b0,(char *)local_f0,local_e8);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar9) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar10) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    _Var15._M_p = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_001126ae;
  }
  else {
    if (uVar11 == 1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_b0," \n[Exactly 1 of the following options is required]");
      goto LAB_001126ae;
    }
    uVar13 = 1;
    if (9 < uVar11) {
      uVar8 = uVar11;
      uVar5 = 4;
      do {
        uVar13 = uVar5;
        if (uVar8 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_00112033;
        }
        if (uVar8 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_00112033;
        }
        if (uVar8 < 10000) goto LAB_00112033;
        bVar4 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        uVar5 = uVar13 + 4;
      } while (bVar4);
      uVar13 = uVar13 + 1;
    }
LAB_00112033:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_d0,(ulong)uVar13,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_d0._M_dataplus._M_p,(uint)local_d0._M_string_length,uVar11);
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_d0,0,0," \n[Exactly ",0xb);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar6->_M_dataplus)._M_p;
    paVar9 = &pbVar6->field_2;
    if (paVar10 == paVar9) {
      local_110.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_110.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_110._M_dataplus._M_p = (pointer)paVar10;
    }
    local_110._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_110,"options from the following list are required]");
    local_f0 = &local_e0;
    psVar2 = (size_type *)(pbVar6->_M_dataplus)._M_p;
    paVar10 = &pbVar6->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2 == paVar10) {
      local_e0 = paVar10->_M_allocated_capacity;
      uStack_d8 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_e0 = paVar10->_M_allocated_capacity;
      local_f0 = psVar2;
    }
    local_e8 = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_b0,(char *)local_f0,local_e8);
LAB_00112669:
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
    _Var15._M_p = local_d0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_001126ae;
  }
  operator_delete(_Var15._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_001126ae:
  if (local_b0._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,"\n");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_description(const App *app) const {
    std::string desc = app->get_description();
    auto min_options = app->get_require_option_min();
    auto max_options = app->get_require_option_max();
    if(app->get_required()) {
        desc += " REQUIRED ";
    }
    if((max_options == min_options) && (min_options > 0)) {
        if(min_options == 1) {
            desc += " \n[Exactly 1 of the following options is required]";
        } else {
            desc += " \n[Exactly " + std::to_string(min_options) + "options from the following list are required]";
        }
    } else if(max_options > 0) {
        if(min_options > 0) {
            desc += " \n[Between " + std::to_string(min_options) + " and " + std::to_string(max_options) +
                    " of the follow options are required]";
        } else {
            desc += " \n[At most " + std::to_string(max_options) + " of the following options are allowed]";
        }
    } else if(min_options > 0) {
        desc += " \n[At least " + std::to_string(min_options) + " of the following options are required]";
    }
    return (!desc.empty()) ? desc + "\n" : std::string{};
}